

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocate.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::
node_tmp<std::allocator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>_>_>_>_>
::~node_tmp(node_tmp<std::allocator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>_>_>_>_>
            *this)

{
  allocator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>_>_>_>
  *alloc;
  value_type *x;
  node_tmp<std::allocator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>_>_>_>_>
  *this_local;
  ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>_>_>
  *local_38;
  undefined8 local_30;
  ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>_>_>
  *local_28;
  ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>_>_>
  *local_20;
  node_tmp<std::allocator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>_>_>_>_>
  **local_18;
  node_tmp<std::allocator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>_>_>_>_>
  **local_10;
  
  if (this->node_ != (node_pointer)0x0) {
    alloc = this->alloc_;
    x = ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>_>_>
        ::value_ptr(this->node_);
    func::
    call_destroy<std::allocator<boost::unordered::detail::ptr_node<std::pair<std::__cxx11::string_const,boost::variant<spartsi::node,spartsi::ref_node>>>>,std::pair<std::__cxx11::string_const,boost::variant<spartsi::node,spartsi::ref_node>>>
              (alloc,x);
    local_38 = this->node_;
    local_18 = &this_local;
    local_10 = &this_local;
    local_30 = 0;
    local_28 = local_38;
    local_20 = local_38;
    this_local = (node_tmp<std::allocator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>_>_>_>_>
                  *)local_38;
    func::
    destroy<boost::unordered::detail::ptr_node<std::pair<std::__cxx11::string_const,boost::variant<spartsi::node,spartsi::ref_node>>>>
              (local_38);
    std::
    allocator_traits<std::allocator<boost::unordered::detail::ptr_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::variant<spartsi::node,_spartsi::ref_node>_>_>_>_>
    ::deallocate(this->alloc_,this->node_,1);
  }
  return;
}

Assistant:

node_tmp<Alloc>::~node_tmp()
    {
        if (node_) {
            boost::unordered::detail::func::call_destroy(alloc_,
                node_->value_ptr());
            boost::unordered::detail::func::destroy(
                boost::addressof(*node_));
            node_allocator_traits::deallocate(alloc_, node_, 1);
        }
    }